

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *pObj)

{
  Abc_Obj_t *pNode;
  int iVar1;
  long lVar2;
  
  iVar1 = (pObj->vFanins).nSize;
  if ((iVar1 != 0) && ((iVar1 != 1 || ((*(uint *)&pObj->field_0x14 & 0xf) != 7)))) {
    __assert_fail("Abc_ObjFaninNum(pObj) == 0 || Abc_SclObjIsBufInv(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x146,"void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *)");
  }
  lVar2 = 0;
  while( true ) {
    if ((pObj->vFanouts).nSize <= lVar2) {
      return;
    }
    pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]];
    iVar1 = (pNode->vFanins).nSize;
    if (iVar1 < 1) break;
    if ((iVar1 == 1) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
      Abc_NodeInvUpdateFanPolarity(pNode);
    }
    else {
      iVar1 = Abc_NodeFindFanin(pNode,pObj);
      Abc_ObjFaninFlipPhase(pNode,iVar1);
    }
    lVar2 = lVar2 + 1;
  }
  __assert_fail("Abc_ObjFaninNum(pFanout) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0x149,"void Abc_NodeInvUpdateFanPolarity(Abc_Obj_t *)");
}

Assistant:

void Abc_NodeInvUpdateFanPolarity( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjFaninNum(pObj) == 0 || Abc_SclObjIsBufInv(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        assert( Abc_ObjFaninNum(pFanout) > 0 );
        if ( Abc_SclObjIsBufInv(pFanout) )
            Abc_NodeInvUpdateFanPolarity( pFanout );
        else
            Abc_ObjFaninFlipPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) );
    }
}